

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O1

ssize_t __thiscall blc::network::Socket::write(Socket *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  exception *peVar2;
  int *piVar3;
  char *__s;
  undefined4 in_register_00000034;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  if (this->_opened == false) {
    peVar2 = (exception *)__cxa_allocate_exception(0x78);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"not opened","");
    error::exception::exception(peVar2,&local_60);
    __cxa_throw(peVar2,&error::exception::typeinfo,error::exception::~exception);
  }
  sVar1 = send(this->_socket,*(void **)CONCAT44(in_register_00000034,__fd),
               ((undefined8 *)CONCAT44(in_register_00000034,__fd))[1],0x4000);
  if (sVar1 != -1) {
    return sVar1;
  }
  peVar2 = (exception *)__cxa_allocate_exception(0x78);
  piVar3 = __errno_location();
  __s = strerror(*piVar3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_61);
  error::exception::exception(peVar2,&local_40);
  __cxa_throw(peVar2,&error::exception::typeinfo,error::exception::~exception);
}

Assistant:

void blc::network::Socket::write(const std::string &request) const {
	if (this->_opened == false)
		throw blc::error::exception("not opened");
	if (::send(this->_socket, request.c_str(), request.size(), MSG_NOSIGNAL) == -1)
		throw blc::error::exception(strerror(errno));
}